

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void estimate_single_ref_frame_costs
               (AV1_COMMON *cm,MACROBLOCKD *xd,ModeCosts *mode_costs,int segment_id,BLOCK_SIZE bsize
               ,uint *ref_costs_single)

{
  int iVar1;
  uint8_t in_CL;
  long in_RDX;
  MACROBLOCKD *in_RDI;
  BLOCK_SIZE in_R8B;
  undefined4 *in_R9;
  int comp_ref_type_ctx;
  uint base_cost;
  int intra_inter_ctx;
  int seg_ref_active;
  MACROBLOCKD *in_stack_00000040;
  int local_34;
  
  iVar1 = segfeature_active((segmentation *)(in_RDI[1].plane[1].seg_iqmatrix[7] + 10),in_CL,'\x05');
  if (iVar1 == 0) {
    iVar1 = av1_get_intra_inter_context(in_RDI);
    *in_R9 = *(undefined4 *)(in_RDX + 0x3f18 + (long)iVar1 * 8);
    local_34 = *(int *)(in_RDX + 0x3f1c + (long)iVar1 * 8);
    if (*(char *)((long)&in_RDI->mi_row + 1) == '\x02') {
      iVar1 = is_comp_ref_allowed(in_R8B);
      if (iVar1 != 0) {
        iVar1 = av1_get_comp_reference_type_context(in_stack_00000040);
        local_34 = *(int *)(in_RDX + (long)iVar1 * 0xc + 0x3dfc) + local_34;
      }
    }
    in_R9[1] = local_34;
    in_R9[4] = local_34;
    in_R9[7] = local_34;
    in_R9[1] = *(int *)(in_RDX + 0x3d40) + in_R9[1];
    in_R9[4] = *(int *)(in_RDX + 0x3d44) + in_R9[4];
    in_R9[4] = *(int *)(in_RDX + 0x3d48) + in_R9[4];
    in_R9[7] = *(int *)(in_RDX + 0x3d44) + in_R9[7];
    in_R9[7] = *(int *)(in_RDX + 0x3d50) + in_R9[7];
  }
  else {
    memset(in_R9,0,0x20);
  }
  return;
}

Assistant:

static void estimate_single_ref_frame_costs(const AV1_COMMON *cm,
                                            const MACROBLOCKD *xd,
                                            const ModeCosts *mode_costs,
                                            int segment_id, BLOCK_SIZE bsize,
                                            unsigned int *ref_costs_single) {
  int seg_ref_active =
      segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME);
  if (seg_ref_active) {
    memset(ref_costs_single, 0, REF_FRAMES * sizeof(*ref_costs_single));
  } else {
    int intra_inter_ctx = av1_get_intra_inter_context(xd);
    ref_costs_single[INTRA_FRAME] =
        mode_costs->intra_inter_cost[intra_inter_ctx][0];
    unsigned int base_cost = mode_costs->intra_inter_cost[intra_inter_ctx][1];
    if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT &&
        is_comp_ref_allowed(bsize)) {
      const int comp_ref_type_ctx = av1_get_comp_reference_type_context(xd);
      base_cost += mode_costs->comp_ref_type_cost[comp_ref_type_ctx][1];
    }
    ref_costs_single[LAST_FRAME] = base_cost;
    ref_costs_single[GOLDEN_FRAME] = base_cost;
    ref_costs_single[ALTREF_FRAME] = base_cost;
    // add cost for last, golden, altref
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[0][0][0];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[0][0][1];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[0][1][0];
    ref_costs_single[ALTREF_FRAME] += mode_costs->single_ref_cost[0][0][1];
    ref_costs_single[ALTREF_FRAME] += mode_costs->single_ref_cost[0][2][0];
  }
}